

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

node_type * __thiscall
phmap::priv::
btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
::new_internal_node(btree<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
                    *this,node_type *parent)

{
  btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
  *this_00;
  
  this_00 = (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
             *)Allocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<long_const,long>>>
                         (&(this->root_).
                           super__Tuple_impl<0UL,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                           .
                           super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>_*>
                           .
                           super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_false>
                           ._M_head_impl,0x180);
  if (((ulong)this_00 & 7) == 0) {
    *(node_type **)this_00 = parent;
    *(undefined4 *)(this_00 + 8) = 0;
    btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_true>_>
    ::mutable_child(this_00,0);
    return this_00;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
               );
}

Assistant:

node_type* new_internal_node(node_type *parent) {
            node_type *p = allocate(node_type::InternalSize());
            return node_type::init_internal(p, parent);
        }